

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::SetBbrDataset
          (CommissionerImpl *this,ErrorHandler *aHandler,BbrDataset *aDataset)

{
  type tVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Error error;
  writer write;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  undefined1 local_1c8 [8];
  uchar *local_1c0;
  char local_1b8 [8];
  uchar local_1b0 [16];
  type local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  string local_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  undefined1 local_148 [24];
  parse_func local_130 [1];
  writer local_128;
  _Any_data local_120;
  code *local_110;
  _Any_data local_100;
  code *local_f0;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  char local_c8 [16];
  Message local_b8;
  
  local_198 = local_188;
  local_1a0 = 0;
  local_190 = 0;
  local_188[0] = 0;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_100,aHandler);
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar3 == '\0') {
    local_158 = (undefined1  [8])((ulong)local_158 & 0xffffffff00000000);
    local_150._M_p = "the commissioner is not active";
    local_148._0_8_ = 0x1e;
    local_148._8_8_ = 0;
    local_130[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_148._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_158;
    do {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_158);
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_158;
    ::fmt::v10::vformat_abi_cxx11_(&local_178,(v10 *)0x24ee20,(string_view)ZEXT816(0x1e),args_00);
    local_1c8._0_4_ = 0xf;
    local_1c0 = local_1b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,local_178._M_dataplus._M_p,
               local_178._M_dataplus._M_p + local_178._M_string_length);
    local_1a0 = local_1c8._0_4_;
LAB_001c1efc:
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1c0);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) goto LAB_001c1f26;
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 == '\0') {
      local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
      pcVar5 = "sending MGMT_BBR_SET.req is only valid in CCM mode";
      local_150._M_p = "sending MGMT_BBR_SET.req is only valid in CCM mode";
      local_148._0_8_ = 0x32;
      local_148._8_8_ = 0;
      local_130[0] = (parse_func)0x0;
      local_148._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      local_128.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      do {
        if (pcVar5 == "") break;
        pcVar4 = pcVar5;
        if (*pcVar5 == '{') {
LAB_001c1d55:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_128,pcVar5,pcVar4);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar4,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_158);
          bVar6 = true;
        }
        else {
          pcVar4 = pcVar5 + 1;
          bVar6 = pcVar4 != "";
          if (bVar6) {
            if (*pcVar4 != '{') {
              pcVar2 = pcVar5 + 2;
              do {
                pcVar4 = pcVar2;
                bVar6 = pcVar4 != "";
                if (pcVar4 == "") goto LAB_001c1d51;
                pcVar2 = pcVar4 + 1;
              } while (*pcVar4 != '{');
            }
            bVar6 = true;
          }
LAB_001c1d51:
          if (bVar6) goto LAB_001c1d55;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_128,pcVar5,"");
          bVar6 = false;
        }
      } while (bVar6);
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_158;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_178,(v10 *)"sending MGMT_BBR_SET.req is only valid in CCM mode",
                 (string_view)ZEXT816(0x32),args_01);
      local_1c8._0_4_ = 0xf;
      local_1c0 = local_1b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,local_178._M_dataplus._M_p,
                 local_178._M_dataplus._M_p + local_178._M_string_length);
      local_1a0 = local_1c8._0_4_;
      goto LAB_001c1efc;
    }
    if ((aDataset->mPresentFlags & 0x2000) != 0) {
      local_158 = (undefined1  [8])((ulong)(uint)local_158._4_4_ << 0x20);
      pcVar5 = "trying to set Registrar IPv6 Address which is read-only";
      local_150._M_p = "trying to set Registrar IPv6 Address which is read-only";
      local_148._0_8_ = 0x37;
      local_148._8_8_ = 0;
      local_130[0] = (parse_func)0x0;
      local_148._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      local_128.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_158;
      do {
        if (pcVar5 == "") break;
        pcVar4 = pcVar5;
        if (*pcVar5 == '{') {
LAB_001c1e6c:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_128,pcVar5,pcVar4);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar4,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_158);
          bVar6 = true;
        }
        else {
          pcVar4 = pcVar5 + 1;
          bVar6 = pcVar4 != "";
          if (bVar6) {
            if (*pcVar4 != '{') {
              pcVar2 = pcVar5 + 2;
              do {
                pcVar4 = pcVar2;
                bVar6 = pcVar4 != "";
                if (pcVar4 == "") goto LAB_001c1e68;
                pcVar2 = pcVar4 + 1;
              } while (*pcVar4 != '{');
            }
            bVar6 = true;
          }
LAB_001c1e68:
          if (bVar6) goto LAB_001c1e6c;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_128,pcVar5,"");
          bVar6 = false;
        }
      } while (bVar6);
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)local_158;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_178,(v10 *)"trying to set Registrar IPv6 Address which is read-only",
                 (string_view)ZEXT816(0x37),args_02);
      local_1c8._0_4_ = 2;
      local_1c0 = local_1b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,local_178._M_dataplus._M_p,
                 local_178._M_dataplus._M_p + local_178._M_string_length);
      local_1a0 = local_1c8._0_4_;
      goto LAB_001c1efc;
    }
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"/c/bs","");
    coap::Message::SetUriPath((Error *)local_158,&local_b8,(string *)local_1c8);
    local_1a0 = local_158._0_4_;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_150);
    tVar1 = local_1a0;
    pcVar5 = local_148 + 8;
    if (local_150._M_p != pcVar5) {
      operator_delete(local_150._M_p);
    }
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8);
    }
    if (tVar1 != none_type) goto LAB_001c1f26;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
    tlv::Tlv::Tlv((Tlv *)local_1c8,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
    AppendTlv((Error *)local_158,&local_b8,(Tlv *)local_1c8);
    local_1a0 = local_158._0_4_;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_150);
    tVar1 = local_1a0;
    if (local_150._M_p != pcVar5) {
      operator_delete(local_150._M_p);
    }
    if (local_1c0 != (uchar *)0x0) {
      operator_delete(local_1c0);
    }
    if (tVar1 != none_type) goto LAB_001c1f26;
    EncodeBbrDataset((Error *)local_158,&local_b8,aDataset);
    local_1a0 = local_158._0_4_;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_150);
    tVar1 = local_1a0;
    if (local_150._M_p != pcVar5) {
      operator_delete(local_150._M_p);
    }
    if (tVar1 != none_type) goto LAB_001c1f26;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      SignRequest((Error *)local_158,this,&local_b8,kMeshCoP,true);
      local_1a0 = local_158._0_4_;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_150);
      tVar1 = local_1a0;
      if (local_150._M_p != pcVar5) {
        operator_delete(local_150._M_p);
      }
      if (tVar1 != none_type) goto LAB_001c1f26;
    }
    std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
    function<ot::commissioner::CommissionerImpl::SetBbrDataset(std::function<void(ot::commissioner::Error)>,ot::commissioner::BbrDataset_const&)::__2&,void>
              ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
               local_120._M_pod_data,(anon_class_32_1_d0c21527 *)&local_100);
    ProxyClient::SendRequest
              (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_120,0xfc00,0xf0bf);
    if (local_110 != (code *)0x0) {
      (*local_110)(&local_120,&local_120,__destroy_functor);
    }
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"mgmt","");
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_178;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_1c8,(v10 *)"sent MGMT_BBR_SET.req",(string_view)ZEXT816(0x15),args);
    Log(kDebug,(string *)local_158,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8);
    }
    local_178._M_dataplus._M_p = (pointer)local_158;
    if (local_158 == (undefined1  [8])local_148) goto LAB_001c1f26;
  }
  operator_delete(local_178._M_dataplus._M_p);
LAB_001c1f26:
  if (local_1a0 != none_type) {
    local_e0._0_4_ = local_1a0;
    local_d8._M_p = local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_198,local_198 + local_190);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_e0);
    if (local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p);
    }
  }
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  return;
}

Assistant:

void CommissionerImpl::SetBbrDataset(ErrorHandler aHandler, const BbrDataset &aDataset)
{
    Error error;

    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError));
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("sending MGMT_BBR_SET.req is only valid in CCM mode"));
    VerifyOrExit((aDataset.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit) == 0,
                 error = ERROR_INVALID_ARGS("trying to set Registrar IPv6 Address which is read-only"));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtBbrSet));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = EncodeBbrDataset(request, aDataset));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_BBR_SET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}